

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmptyPort.hpp
# Opt level: O0

bool empty_port::impl<(empty_port::Kind)0>::can_listen(port_t port,char *host)

{
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  int in_ECX;
  int __protocol;
  char *pcVar1;
  int __type;
  int __type_00;
  int __type_01;
  int iVar2;
  sockaddr_in *addr_00;
  sockaddr *__addr;
  undefined1 local_2c [8];
  sockaddr_in addr;
  SocketHolder sh;
  char *host_local;
  port_t port_local;
  
  unique0x10000191 = host;
  iVar2 = socket(2,1,0);
  SocketHolder::SocketHolder((SocketHolder *)addr.sin_zero,iVar2);
  iVar2 = SocketHolder::socket((SocketHolder *)addr.sin_zero,iVar2,__type,in_ECX);
  addr_00 = (sockaddr_in *)local_2c;
  pcVar1 = stack0xffffffffffffffe8;
  fill_struct((socket_t *)CONCAT44(extraout_var,iVar2),addr_00,port,stack0xffffffffffffffe8);
  __protocol = (int)pcVar1;
  iVar2 = SocketHolder::socket((SocketHolder *)addr.sin_zero,(int)addr_00,__type_00,__protocol);
  __addr = (sockaddr *)local_2c;
  iVar2 = bind(*(int *)CONCAT44(extraout_var_00,iVar2),__addr,0x10);
  if (iVar2 < 0) {
    host_local._7_1_ = false;
  }
  else {
    iVar2 = SocketHolder::socket((SocketHolder *)addr.sin_zero,(int)__addr,__type_01,__protocol);
    iVar2 = listen(*(int *)CONCAT44(extraout_var_01,iVar2),1);
    if (iVar2 == 0) {
      host_local._7_1_ = true;
    }
    else {
      host_local._7_1_ = false;
    }
  }
  SocketHolder::~SocketHolder((SocketHolder *)addr.sin_zero);
  return host_local._7_1_;
}

Assistant:

inline bool impl<TCP>::can_listen(const port_t port, const char *host) {
    SocketHolder sh(socket(AF_INET, SOCK_STREAM, 0));
    sockaddr_in addr;
    fill_struct(sh.socket(), addr, port, host);

    if (bind(sh.socket(), (struct sockaddr *)&addr, sizeof(addr)) < 0) {
        return false;
    }
    if (listen(sh.socket(), 1)) {
        return false;
    }

    /* success */
    return true;
}